

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void EthBasePort::PrintFirewirePacket(ostream *out,quadlet_t *packet,uint max_quads)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  uint j;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint local_38;
  
  if (max_quads < 4) {
    poVar6 = std::operator<<(out,"PrintPacket: should print more than 4 quadlets (max_quads = ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,")");
    goto LAB_0010fd19;
  }
  bVar1 = (byte)*packet;
  bVar4 = bVar1 >> 4;
  poVar6 = std::operator<<(out,"Firewire Packet:");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(out,"  dest: ");
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", node: ");
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", tl: ");
  lVar2 = *(long *)poVar6;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
  poVar6 = std::operator<<(poVar6,0x30);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", rt: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", tcode: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," (");
  poVar6 = std::operator<<(poVar6,_ZZN11EthBasePort19PrintFirewirePacketERSoPKjjE10tcode_name_rel +
                                  *(int *)(
                                          _ZZN11EthBasePort19PrintFirewirePacketERSoPKjjE10tcode_name_rel
                                          + (ulong)bVar4 * 4));
  poVar6 = std::operator<<(poVar6,")");
  poVar6 = std::operator<<(poVar6,", pri: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(out,"  src: ");
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", node: ");
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  if ((bVar1 & 0xe0) == 0x60) {
    poVar6 = std::operator<<(out,", rcode: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  }
  else if ((((bVar1 & 0xb0) == 0x10) || (bVar1 < 0x10)) || (bVar4 == 4)) {
    poVar6 = std::operator<<(out,", dest_off: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(out,"  dest_off: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  std::endl<char,std::char_traits<char>>(out);
  if ((bVar4 < 8) && ((0xa2U >> (uint)bVar4 & 1) != 0)) {
    uVar5 = packet[3];
    uVar9 = (ulong)(uVar5 >> 0x10);
    poVar6 = std::operator<<(out,"  data_length: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,", ext_tcode: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar6);
    if ((uVar5 & 0x30000) != 0) {
      poVar6 = std::operator<<(out,"WARNING: data_length is not a multiple of 4");
LAB_0010fcc2:
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  else {
    uVar9 = 0;
    if (bVar1 < 0x10 || bVar4 == 6) {
      poVar6 = std::operator<<(out,"  data: ");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      uVar9 = 0;
      goto LAB_0010fcc2;
    }
  }
  if (bVar4 == 4) {
    poVar6 = std::operator<<(out,"  header_crc: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  }
  else {
    if (max_quads == 4) {
      return;
    }
    poVar6 = std::operator<<(out,"  header_crc: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar6);
    if ((bVar4 != 7) && (bVar4 != 1)) {
      return;
    }
    uVar7 = max_quads - 5;
    uVar5 = (uint)(uVar9 >> 2);
    uVar10 = (ulong)uVar7;
    if (uVar5 < uVar7) {
      uVar10 = uVar9 >> 2;
    }
    for (uVar11 = 0; uVar11 < uVar10; uVar11 = uVar11 + 4) {
      poVar6 = std::operator<<(out,"  data[");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar6 = std::operator<<(poVar6,0x20);
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 3;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,":");
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 3;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,"]:  ");
      for (uVar8 = 0; (uVar8 < 4 && (uVar11 + uVar8 < uVar10)); uVar8 = uVar8 + 1) {
        lVar2 = *(long *)out;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 8;
        poVar6 = std::operator<<(out,0x30);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::operator<<(poVar6,"  ");
      }
      std::endl<char,std::char_traits<char>>(out);
    }
    local_38 = (uint)uVar9;
    if (local_38 < 4 || uVar7 <= uVar5) {
      return;
    }
    poVar6 = std::operator<<(out,"  data_crc: ");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
  }
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_0010fd19:
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void EthBasePort::PrintFirewirePacket(std::ostream &out, const quadlet_t *packet, unsigned int max_quads)
{
    static const char *tcode_name[16] = { "qwrite", "bwrite", "wresponse", "", "qread", "bread",
                                          "qresponse", "bresponse", "cycstart", "lockreq",
                                          "stream", "lockresp", "", "", "", "" };
    unsigned char tcode = (packet[0]&0x000000F0)>>4;
    unsigned int data_length = 0;
    // No point in printing anything if less than 4
    if (max_quads < 4) {
        out << "PrintPacket: should print more than 4 quadlets (max_quads = "
            << max_quads << ")" << std::endl;
        return;
    }
    out << "Firewire Packet:" << std::endl;
    out << "  dest: " << std::hex << ((packet[0]&0xffc00000)>>20)
        << ", node: " << std::dec << ((packet[0]&0x003f0000)>>16)
        << ", tl: " << std::hex << std::setw(2) << std::setfill('0') << ((packet[0]&0x0000fc00)>>10)
        << ", rt: " << ((packet[0]&0x00000300)>>8)
        << ", tcode: " << static_cast<unsigned int>(tcode) << " (" << tcode_name[tcode] << ")"
        << ", pri: " << (packet[0]&0x0000000F) << std::endl;
    out << "  src: " << std::hex << ((packet[1]&0xffc00000)>>20)
        << ", node: " << std::dec << ((packet[1]&0x003f0000)>>16);

    if ((tcode == QRESPONSE) || (tcode == BRESPONSE)) {
        out << ", rcode: " << std::dec << ((packet[1]&0x0000f0000)>>12);
    }
    else if ((tcode == QWRITE) || (tcode == QREAD) || (tcode == BWRITE) || (tcode == BREAD)) {
        out << ", dest_off: " << std::hex << (packet[1]&0x0000ffff) << std::endl;
        out << "  dest_off: " << packet[2] << std::dec;
    }
    out << std::endl;

    if ((tcode == BWRITE) || (tcode == BRESPONSE) || (tcode == BREAD)) {
        data_length = (packet[3]&0xffff0000) >> 16;
        out << "  data_length: " << std::dec << data_length
            << ", ext_tcode: " << std::hex << (packet[3]&0x0000ffff) << std::dec << std::endl;
        if (data_length%4 != 0)
            out << "WARNING: data_length is not a multiple of 4" << std::endl;
    }
    else if ((tcode == QWRITE) || (tcode == QRESPONSE)) {
        out << "  data: " << std::hex << packet[3] << std::dec << std::endl;
    }

    if (tcode == QREAD)
        out << "  header_crc: " << std::hex << packet[3] << std::dec << std::endl;
    else if (max_quads < 5)  // Nothing else to do for short packets
        return;
    else
        out << "  header_crc: " << std::hex << packet[4] << std::dec << std::endl;

    if ((tcode == BWRITE) || (tcode == BRESPONSE)) {
        data_length /= sizeof(quadlet_t);   // data_length in quadlets
        unsigned int lim = (data_length <= max_quads-5) ? data_length : max_quads-5;
        for (unsigned int i = 0; i < lim; i += 4) {
            out << "  data[" << std::dec << std::setfill(' ') << std::setw(3) << i << ":"
                << std::setw(3) << (i+3) << "]:  ";
            for (unsigned int j = 0; (j < 4) && ((i+j) < lim); j++)
                out << std::hex << std::setw(8) << std::setfill('0') << packet[5+i+j] << std::dec << "  ";
            out << std::endl;
        }
        if ((data_length > 0) && (data_length < max_quads-5))
            out << "  data_crc: " << std::hex << packet[5+data_length] << std::dec << std::endl;
    }
}